

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

url * __thiscall m2d::savanna::endpoint::url(url *__return_storage_ptr__,endpoint *this)

{
  string local_38;
  endpoint *local_18;
  endpoint *this_local;
  
  local_18 = this;
  this_local = (endpoint *)__return_storage_ptr__;
  (*this->_vptr_endpoint[8])();
  savanna::url::url(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

savanna::url url()
		{
			return savanna::url(build_url_str());
		}